

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O0

__sighandler_t __thiscall
axl::sys::CondMutexEventBase<axl::sl::False>::signal
          (CondMutexEventBase<axl::sl::False> *this,int __sig,__sighandler_t __handler)

{
  bool bVar1;
  ulong extraout_RAX;
  __sighandler_t p_Var2;
  undefined8 extraout_RAX_00;
  ulong uVar3;
  __sighandler_t __handler_00;
  bool result;
  byte local_21;
  False local_12;
  byte local_11;
  CondMutexEventBase<axl::sl::False> *local_10;
  undefined1 local_1;
  
  local_10 = this;
  psx::CondMutexPair::lock((CondMutexPair *)0x1a7f88);
  if ((this->m_state & 1U) == 0) {
    this->m_state = true;
    bVar1 = sl::False::operator()(&local_12);
    if (bVar1) {
      local_21 = psx::CondMutexPair::broadcast((CondMutexPair *)0x1a7fc8);
    }
    else {
      p_Var2 = psx::CondMutexPair::signal(&this->m_condMutexPair,__sig,__handler_00);
      local_21 = (byte)p_Var2;
    }
    local_11 = local_21 & 1;
    psx::CondMutexPair::unlock((CondMutexPair *)0x1a7ff0);
    uVar3 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),local_11) & 0xffffffffffffff01;
    local_1 = (undefined1)uVar3;
  }
  else {
    psx::CondMutexPair::unlock((CondMutexPair *)0x1a7f9e);
    local_1 = 1;
    uVar3 = extraout_RAX;
  }
  return (__sighandler_t)CONCAT71((int7)(uVar3 >> 8),local_1);
}

Assistant:

bool
	signal() {
		m_condMutexPair.lock();
		if (m_state) {
			m_condMutexPair.unlock();
			return true;
		}

		m_state = true;

		bool result = IsNotificationEvent()() ?
			m_condMutexPair.broadcast() :
			m_condMutexPair.signal();

		m_condMutexPair.unlock();
		return result;
	}